

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::ShaderOperatorCase::setupShaderData(ShaderOperatorCase *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  ostream *poVar5;
  int precision_00;
  char *local_5b8;
  Precision local_514;
  Precision local_510;
  ostringstream *local_500;
  char *local_4f8;
  string local_4e8 [32];
  string local_4c8 [32];
  int local_4a8;
  allocator<char> local_4a1;
  int inputNdx_4;
  string local_480;
  string local_460;
  allocator<char> local_439;
  string local_438;
  string local_418;
  string local_3f8;
  float local_3d8;
  float local_3d4;
  float resultBias;
  float resultScale;
  int outScalarSize;
  bool isResFloatVec;
  bool isBoolOut;
  char *outTypeName;
  char *swizzle;
  char *typeName;
  int local_3a8;
  bool isBool;
  bool isUint;
  DataType DStack_3a4;
  bool isInt;
  int inSize;
  DataType inType;
  int inputNdx_3;
  string prefix;
  int inputNdx_2;
  int inputNdx_1;
  Precision prec;
  bool isUintVal;
  bool isIntVal;
  bool isBoolVal;
  int inputNdx;
  string header;
  ostringstream *op;
  ostringstream local_328 [8];
  ostringstream frag;
  ostringstream local_1b0 [8];
  ostringstream vtx;
  char *inputPrecision [3];
  char *precision;
  ShaderOperatorCase *this_local;
  
  if ((this->m_spec).precision == PRECISION_LAST) {
    local_4f8 = (char *)0x0;
  }
  else {
    local_4f8 = glu::getPrecisionName((this->m_spec).precision);
  }
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  std::__cxx11::ostringstream::ostringstream(local_328);
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
    local_500 = local_328;
  }
  else {
    local_500 = local_1b0;
  }
  header.field_2._8_8_ = local_500;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inputNdx,"#version 310 es\n",(allocator<char> *)&isBoolVal);
  std::allocator<char>::~allocator((allocator<char> *)&isBoolVal);
  std::operator<<((ostream *)local_1b0,(string *)&inputNdx);
  std::operator<<((ostream *)local_328,(string *)&inputNdx);
  for (prec = PRECISION_LOWP; (int)prec < (this->m_spec).numInputs; prec = prec + PRECISION_MEDIUMP)
  {
    bVar1 = de::inRange<int>((this->m_spec).inputs[(int)prec].type,0x23,0x26);
    bVar2 = de::inRange<int>((this->m_spec).inputs[(int)prec].type,0x1b,0x1e);
    bVar3 = de::inRange<int>((this->m_spec).inputs[(int)prec].type,0x1f,0x22);
    if (bVar1) {
      local_510 = PRECISION_MEDIUMP;
    }
    else {
      if ((bVar2) || (bVar3)) {
        local_514 = PRECISION_HIGHP;
      }
      else {
        local_514 = (this->m_spec).precision;
      }
      local_510 = local_514;
    }
    pcVar4 = glu::getPrecisionName(local_510);
    inputPrecision[(long)(int)prec + -1] = pcVar4;
  }
  std::operator<<((ostream *)local_1b0,"layout(location = 0) in highp vec4 a_position;\n");
  for (prefix.field_2._12_4_ = 0; (int)prefix.field_2._12_4_ < (this->m_spec).numInputs;
      prefix.field_2._12_4_ = prefix.field_2._12_4_ + 1) {
    poVar5 = std::operator<<((ostream *)local_1b0,"layout(location = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,prefix.field_2._12_4_ + 4);
    poVar5 = std::operator<<(poVar5,") in ");
    poVar5 = std::operator<<(poVar5,inputPrecision[(long)(int)prefix.field_2._12_4_ + -1]);
    poVar5 = std::operator<<(poVar5," vec4 a_in");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,prefix.field_2._12_4_);
    std::operator<<(poVar5,";\n");
  }
  std::operator<<((ostream *)local_328,"layout(location = 0) out mediump vec4 o_color;\n");
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
    for (prefix.field_2._8_4_ = 0; (int)prefix.field_2._8_4_ < (this->m_spec).numInputs;
        prefix.field_2._8_4_ = prefix.field_2._8_4_ + 1) {
      poVar5 = std::operator<<((ostream *)local_1b0,"layout(location = ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,prefix.field_2._8_4_ + 1);
      poVar5 = std::operator<<(poVar5,") out ");
      poVar5 = std::operator<<(poVar5,inputPrecision[(long)(int)prefix.field_2._8_4_ + -1]);
      poVar5 = std::operator<<(poVar5," vec4 v_in");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,prefix.field_2._8_4_);
      std::operator<<(poVar5,";\n");
      poVar5 = std::operator<<((ostream *)local_328,"layout(location = ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,prefix.field_2._8_4_ + 1);
      poVar5 = std::operator<<(poVar5,") in ");
      poVar5 = std::operator<<(poVar5,inputPrecision[(long)(int)prefix.field_2._8_4_ + -1]);
      poVar5 = std::operator<<(poVar5," vec4 v_in");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,prefix.field_2._8_4_);
      std::operator<<(poVar5,";\n");
    }
  }
  else {
    std::operator<<((ostream *)local_1b0,"layout(location = 0) out mediump vec4 v_color;\n");
    std::operator<<((ostream *)local_328,"layout(location = 0) in mediump vec4 v_color;\n");
  }
  std::operator<<((ostream *)local_1b0,"\n");
  std::operator<<((ostream *)local_1b0,"void main()\n");
  std::operator<<((ostream *)local_1b0,"{\n");
  std::operator<<((ostream *)local_1b0,"\tgl_Position = a_position;\n");
  std::operator<<((ostream *)local_328,"\n");
  std::operator<<((ostream *)local_328,"void main()\n");
  std::operator<<((ostream *)local_328,"{\n");
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
    local_5b8 = "v_";
  }
  else {
    local_5b8 = "a_";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inputNdx_3,local_5b8,(allocator<char> *)((long)&inType + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&inType + 3));
  for (inSize = 0; inSize < (this->m_spec).numInputs; inSize = inSize + 1) {
    DStack_3a4 = (this->m_spec).inputs[inSize].type;
    local_3a8 = glu::getDataTypeScalarSize(DStack_3a4);
    typeName._7_1_ = de::inRange<int>(DStack_3a4,0x1b,0x1e);
    typeName._6_1_ = de::inRange<int>(DStack_3a4,0x1f,0x22);
    typeName._5_1_ = de::inRange<int>(DStack_3a4,0x23,0x26);
    swizzle = glu::getDataTypeName(DStack_3a4);
    outTypeName = *(char **)(sr::(anonymous_namespace)::s_inSwizzles +
                            (long)(local_3a8 + -1) * 8 + (long)inSize * 0x20);
    std::operator<<((ostream *)header.field_2._8_8_,"\t");
    if ((local_4f8 != (char *)0x0) && ((typeName._5_1_ & 1) == 0)) {
      poVar5 = std::operator<<((ostream *)header.field_2._8_8_,local_4f8);
      std::operator<<(poVar5," ");
    }
    poVar5 = std::operator<<((ostream *)header.field_2._8_8_,swizzle);
    poVar5 = std::operator<<(poVar5," in");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,inSize);
    std::operator<<(poVar5," = ");
    if ((typeName._5_1_ & 1) == 0) {
      if (((typeName._7_1_ & 1) != 0) || ((typeName._6_1_ & 1) != 0)) {
        poVar5 = std::operator<<((ostream *)header.field_2._8_8_,swizzle);
        std::operator<<(poVar5,"(");
      }
    }
    else if (local_3a8 == 1) {
      std::operator<<((ostream *)header.field_2._8_8_,"(");
    }
    else {
      std::operator<<((ostream *)header.field_2._8_8_,"greaterThan(");
    }
    poVar5 = std::operator<<((ostream *)header.field_2._8_8_,(string *)&inputNdx_3);
    poVar5 = std::operator<<(poVar5,"in");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,inSize);
    poVar5 = std::operator<<(poVar5,".");
    std::operator<<(poVar5,outTypeName);
    if ((typeName._5_1_ & 1) == 0) {
      if (((typeName._7_1_ & 1) != 0) || ((typeName._6_1_ & 1) != 0)) {
        std::operator<<((ostream *)header.field_2._8_8_,")");
      }
    }
    else if (local_3a8 == 1) {
      std::operator<<((ostream *)header.field_2._8_8_," > 0.0)");
    }
    else {
      poVar5 = std::operator<<((ostream *)header.field_2._8_8_,", vec");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_3a8);
      std::operator<<(poVar5,"(0.0))");
    }
    std::operator<<((ostream *)header.field_2._8_8_,";\n");
  }
  _outScalarSize = glu::getDataTypeName((this->m_spec).output);
  resultScale._3_1_ = de::inRange<int>((this->m_spec).output,0x23,0x26);
  std::operator<<((ostream *)header.field_2._8_8_,"\t");
  if ((local_4f8 != (char *)0x0) && ((resultScale._3_1_ & 1) == 0)) {
    poVar5 = std::operator<<((ostream *)header.field_2._8_8_,local_4f8);
    std::operator<<(poVar5," ");
  }
  poVar5 = std::operator<<((ostream *)header.field_2._8_8_,_outScalarSize);
  poVar5 = std::operator<<(poVar5," res = ");
  poVar5 = std::operator<<(poVar5,_outScalarSize);
  std::operator<<(poVar5,"(0.0);\n\n");
  poVar5 = std::operator<<((ostream *)header.field_2._8_8_,"\t");
  poVar5 = std::operator<<(poVar5,(string *)&this->m_shaderOp);
  std::operator<<(poVar5,"\n\n");
  resultScale._2_1_ = de::inRange<int>((this->m_spec).output,1,4);
  resultBias = (float)glu::getDataTypeScalarSize((this->m_spec).output);
  std::operator<<((ostream *)header.field_2._8_8_,"\thighp vec4 color = vec4(0.0, 0.0, 0.0, 1.0);\n"
                 );
  poVar5 = std::operator<<((ostream *)header.field_2._8_8_,"\tcolor.");
  poVar5 = std::operator<<(poVar5,*(char **)(sr::(anonymous_namespace)::s_outSwizzles +
                                            (long)((int)resultBias + -1) * 8));
  std::operator<<(poVar5," = ");
  if (((resultScale._2_1_ & 1) == 0) && (resultBias == 1.4013e-45)) {
    std::operator<<((ostream *)header.field_2._8_8_,"float(res)");
  }
  else if ((resultScale._2_1_ & 1) == 0) {
    poVar5 = std::operator<<((ostream *)header.field_2._8_8_,"vec");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)resultBias);
    std::operator<<(poVar5,"(res)");
  }
  else {
    std::operator<<((ostream *)header.field_2._8_8_,"res");
  }
  std::operator<<((ostream *)header.field_2._8_8_,";\n");
  local_3d4 = (this->m_spec).resultScale;
  local_3d8 = (this->m_spec).resultBias;
  if ((((local_3d4 != 1.0) || (NAN(local_3d4))) || (local_3d8 != 0.0)) || (NAN(local_3d8))) {
    std::operator<<((ostream *)header.field_2._8_8_,"\tcolor = color");
    if ((local_3d4 != 1.0) || (NAN(local_3d4))) {
      poVar5 = std::operator<<((ostream *)header.field_2._8_8_," * ");
      de::toString<float>(&local_418,&local_3d4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"1.0",&local_439);
      twoValuedVec4(&local_3f8,&local_418,&local_438,
                    (BVec4 *)(sr::(anonymous_namespace)::s_outSwizzleChannelMasks +
                             (long)((int)resultBias + -1) * 4));
      std::operator<<(poVar5,(string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_438);
      std::allocator<char>::~allocator(&local_439);
      std::__cxx11::string::~string((string *)&local_418);
    }
    if ((local_3d8 != 0.0) || (NAN(local_3d8))) {
      poVar5 = std::operator<<((ostream *)header.field_2._8_8_," + ");
      de::floatToString_abi_cxx11_(&local_480,(de *)0x2,local_3d8,precision_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&inputNdx_4,"0.0",&local_4a1);
      twoValuedVec4(&local_460,&local_480,(string *)&inputNdx_4,
                    (BVec4 *)(sr::(anonymous_namespace)::s_outSwizzleChannelMasks +
                             (long)((int)resultBias + -1) * 4));
      std::operator<<(poVar5,(string *)&local_460);
      std::__cxx11::string::~string((string *)&local_460);
      std::__cxx11::string::~string((string *)&inputNdx_4);
      std::allocator<char>::~allocator(&local_4a1);
      std::__cxx11::string::~string((string *)&local_480);
    }
    std::operator<<((ostream *)header.field_2._8_8_,";\n");
  }
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
    for (local_4a8 = 0; local_4a8 < (this->m_spec).numInputs; local_4a8 = local_4a8 + 1) {
      poVar5 = std::operator<<((ostream *)local_1b0,"\tv_in");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_4a8);
      poVar5 = std::operator<<(poVar5," = a_in");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_4a8);
      std::operator<<(poVar5,";\n");
    }
    std::operator<<((ostream *)local_328,"\to_color = color;\n");
  }
  else {
    std::operator<<((ostream *)local_1b0,"\tv_color = color;\n");
    std::operator<<((ostream *)local_328,"\to_color = v_color;\n");
  }
  std::operator<<((ostream *)local_1b0,"}\n");
  std::operator<<((ostream *)local_328,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,local_4c8);
  std::__cxx11::string::~string(local_4c8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,local_4e8);
  std::__cxx11::string::~string(local_4e8);
  std::__cxx11::string::~string((string *)&inputNdx_3);
  std::__cxx11::string::~string((string *)&inputNdx);
  std::__cxx11::ostringstream::~ostringstream(local_328);
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return;
}

Assistant:

void ShaderOperatorCase::setupShaderData (void)
{
	const char*			precision	= m_spec.precision != PRECISION_LAST ? getPrecisionName(m_spec.precision) : DE_NULL;
	const char*			inputPrecision[MAX_INPUTS];

	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op			= m_isVertexCase ? vtx : frag;

	std::string			header		=
		"#version 310 es\n";

	vtx << header;
	frag << header;

	// Compute precision for inputs.
	for (int inputNdx = 0; inputNdx < m_spec.numInputs; inputNdx++)
	{
		const bool		isBoolVal	= de::inRange<int>(m_spec.inputs[inputNdx].type, TYPE_BOOL, TYPE_BOOL_VEC4);
		const bool		isIntVal	= de::inRange<int>(m_spec.inputs[inputNdx].type, TYPE_INT, TYPE_INT_VEC4);
		const bool		isUintVal	= de::inRange<int>(m_spec.inputs[inputNdx].type, TYPE_UINT, TYPE_UINT_VEC4);
		// \note Mediump interpolators are used for booleans, and highp for integers.
		const Precision	prec		= isBoolVal	? PRECISION_MEDIUMP
									: isIntVal || isUintVal ? PRECISION_HIGHP
									: m_spec.precision;
		inputPrecision[inputNdx] = getPrecisionName(prec);
	}

	// Attributes.
	vtx << "layout(location = 0) in highp vec4 a_position;\n";
	for (int inputNdx = 0; inputNdx < m_spec.numInputs; inputNdx++)
		vtx << "layout(location = " << 4 + inputNdx << ") in " << inputPrecision[inputNdx] << " vec4 a_in" << inputNdx << ";\n";

	// Color output.
	frag << "layout(location = 0) out mediump vec4 o_color;\n";

	if (m_isVertexCase)
	{
		vtx << "layout(location = 0) out mediump vec4 v_color;\n";
		frag << "layout(location = 0) in mediump vec4 v_color;\n";
	}
	else
	{
		for (int inputNdx = 0; inputNdx < m_spec.numInputs; inputNdx++)
		{
			vtx << "layout(location = " << inputNdx + 1 << ") out " << inputPrecision[inputNdx] << " vec4 v_in" << inputNdx << ";\n";
			frag << "layout(location = " << inputNdx + 1 << ") in " << inputPrecision[inputNdx] << " vec4 v_in" << inputNdx << ";\n";
		}
	}

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "	gl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	// Expression inputs.
	const std::string prefix = m_isVertexCase ? "a_" : "v_";
	for (int inputNdx = 0; inputNdx < m_spec.numInputs; inputNdx++)
	{
		const DataType	inType		= m_spec.inputs[inputNdx].type;
		const int		inSize		= getDataTypeScalarSize(inType);
		const bool		isInt		= de::inRange<int>(inType, TYPE_INT, TYPE_INT_VEC4);
		const bool		isUint		= de::inRange<int>(inType, TYPE_UINT, TYPE_UINT_VEC4);
		const bool		isBool		= de::inRange<int>(inType, TYPE_BOOL, TYPE_BOOL_VEC4);
		const char*		typeName	= getDataTypeName(inType);
		const char*		swizzle		= s_inSwizzles[inputNdx][inSize - 1];

		op << "\t";
		if (precision && !isBool) op << precision << " ";

		op << typeName << " in" << inputNdx << " = ";

		if (isBool)
		{
			if (inSize == 1)	op << "(";
			else				op << "greaterThan(";
		}
		else if (isInt || isUint)
			op << typeName << "(";

		op << prefix << "in" << inputNdx << "." << swizzle;

		if (isBool)
		{
			if (inSize == 1)	op << " > 0.0)";
			else				op << ", vec" << inSize << "(0.0))";
		}
		else if (isInt || isUint)
			op << ")";

		op << ";\n";
	}

	// Result variable.
	{
		const char* outTypeName = getDataTypeName(m_spec.output);
		const bool	isBoolOut	= de::inRange<int>(m_spec.output, TYPE_BOOL, TYPE_BOOL_VEC4);

		op << "\t";
		if (precision && !isBoolOut) op << precision << " ";
		op << outTypeName << " res = " << outTypeName << "(0.0);\n\n";
	}

	// Expression.
	op << "\t" << m_shaderOp << "\n\n";

	// Convert to color.
	const bool	isResFloatVec	= de::inRange<int>(m_spec.output, TYPE_FLOAT, TYPE_FLOAT_VEC4);
	const int	outScalarSize	= getDataTypeScalarSize(m_spec.output);

	op << "\thighp vec4 color = vec4(0.0, 0.0, 0.0, 1.0);\n";
	op << "\tcolor." << s_outSwizzles[outScalarSize-1] << " = ";

	if (!isResFloatVec && outScalarSize == 1)
		op << "float(res)";
	else if (!isResFloatVec)
		op << "vec" << outScalarSize << "(res)";
	else
		op << "res";

	op << ";\n";

	// Scale & bias.
	const float	resultScale	= m_spec.resultScale;
	const float	resultBias	= m_spec.resultBias;
	if ((resultScale != 1.0f) || (resultBias != 0.0f))
	{
		op << "\tcolor = color";
		if (resultScale != 1.0f) op << " * " << twoValuedVec4(de::toString(resultScale),		"1.0", s_outSwizzleChannelMasks[outScalarSize - 1]);
		if (resultBias != 0.0f)  op << " + " << twoValuedVec4(de::floatToString(resultBias, 2),	"0.0", s_outSwizzleChannelMasks[outScalarSize - 1]);
		op << ";\n";
	}

	// ..
	if (m_isVertexCase)
	{
		vtx << "	v_color = color;\n";
		frag << "	o_color = v_color;\n";
	}
	else
	{
		for (int inputNdx = 0; inputNdx < m_spec.numInputs; inputNdx++)
		vtx << "	v_in" << inputNdx << " = a_in" << inputNdx << ";\n";
		frag << "	o_color = color;\n";
	}

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource = vtx.str();
	m_fragShaderSource = frag.str();
}